

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryReader::readImports(WasmBinaryReader *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  _Alloc_hider _Var11;
  size_type sVar12;
  uint32_t uVar13;
  Type TVar14;
  ulong uVar15;
  bool bVar16;
  Name NVar17;
  Signature sig;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  Name name_06;
  Name name_07;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *in_stack_fffffffffffffbf8;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  undefined1 local_378 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedFunctionNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedTableNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedMemoryNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedGlobalNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedTagNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  bool is_shared;
  pair<wasm::Name,_bool> local_100;
  Address local_e8;
  HeapType local_e0;
  ulong local_d8;
  wasm *local_d0;
  wasm *local_c8;
  wasm *local_c0;
  wasm *local_b8;
  wasm *local_b0;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_a8;
  undefined1 auStack_a0 [8];
  Name module;
  Name base;
  HeapType type;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> curr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_31;
  
  uVar13 = getU32LEB(this);
  uVar15 = (ulong)uVar13;
  local_378 = (undefined1  [8])&usedFunctionNames._M_h._M_rehash_policy._M_next_resize;
  usedFunctionNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedFunctionNames._M_h._M_bucket_count = 0;
  usedFunctionNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedFunctionNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedFunctionNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedFunctionNames._M_h._M_rehash_policy._4_4_ = 0;
  usedFunctionNames._M_h._M_rehash_policy._M_next_resize = 0;
  usedFunctionNames._M_h._M_single_bucket =
       (__node_base_ptr)&usedTableNames._M_h._M_rehash_policy._M_next_resize;
  usedTableNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedTableNames._M_h._M_bucket_count = 0;
  usedTableNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedTableNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedTableNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedTableNames._M_h._M_rehash_policy._4_4_ = 0;
  usedTableNames._M_h._M_rehash_policy._M_next_resize = 0;
  usedTableNames._M_h._M_single_bucket =
       (__node_base_ptr)&usedMemoryNames._M_h._M_rehash_policy._M_next_resize;
  usedMemoryNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedMemoryNames._M_h._M_bucket_count = 0;
  usedMemoryNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedMemoryNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedMemoryNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedMemoryNames._M_h._M_rehash_policy._4_4_ = 0;
  usedMemoryNames._M_h._M_rehash_policy._M_next_resize = 0;
  usedMemoryNames._M_h._M_single_bucket =
       (__node_base_ptr)&usedGlobalNames._M_h._M_rehash_policy._M_next_resize;
  usedGlobalNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedGlobalNames._M_h._M_bucket_count = 0;
  usedGlobalNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedGlobalNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedGlobalNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedGlobalNames._M_h._M_rehash_policy._4_4_ = 0;
  usedGlobalNames._M_h._M_rehash_policy._M_next_resize = 0;
  usedGlobalNames._M_h._M_single_bucket =
       (__node_base_ptr)&usedTagNames._M_h._M_rehash_policy._M_next_resize;
  usedTagNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedTagNames._M_h._M_bucket_count = 0;
  usedTagNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedTagNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedTagNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedTagNames._M_h._M_rehash_policy._4_4_ = 0;
  usedTagNames._M_h._M_rehash_policy._M_next_resize = 0;
  local_d0 = (wasm *)&this->tagNames;
  local_c8 = (wasm *)&this->globalNames;
  local_c0 = (wasm *)&this->memoryNames;
  local_b8 = (wasm *)&this->tableNames;
  local_b0 = (wasm *)&this->functionNames;
  local_a8 = &this->functionTypes;
  do {
    bVar16 = uVar15 == 0;
    uVar15 = uVar15 - 1;
    if (bVar16) {
      this->numFuncImports =
           (Index)((ulong)((long)(this->wasm->functions).
                                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->wasm->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&usedGlobalNames._M_h._M_single_bucket);
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&usedMemoryNames._M_h._M_single_bucket);
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&usedTableNames._M_h._M_single_bucket);
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&usedFunctionNames._M_h._M_single_bucket);
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_378);
      return;
    }
    _auStack_a0 = (string_view)getInlineString(this,true);
    join_0x00000010_0x00000000_ = (string_view)getInlineString(this,true);
    uVar13 = getU32LEB(this);
    switch(uVar13) {
    case 0:
      puVar1 = (this->wasm->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar2 = (this->wasm->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,"fimport$",(allocator<char> *)&local_58);
      NVar17 = makeName(&local_3f8,
                        (long)(this->wasm->functions).
                              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->wasm->functions).
                              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3);
      name_03.super_IString.str._M_str = local_378;
      name_03.super_IString.str._M_len = (size_t)NVar17.super_IString.str._M_str;
      getOrMakeName(&local_100,local_b0,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)((ulong)((long)puVar1 - (long)puVar2) >> 3 & 0xffffffff),
                    (Index)NVar17.super_IString.str._M_len,name_03,in_stack_fffffffffffffbf8);
      std::__cxx11::string::~string((string *)&local_3f8);
      uVar13 = getU32LEB(this);
      local_58._M_dataplus._M_p = (pointer)getTypeByIndex(this,uVar13);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                (local_a8,(HeapType *)&local_58);
      base.super_IString.str._M_str = (char *)getTypeByIndex(this,uVar13);
      bVar16 = HeapType::isSignature((HeapType *)&base.super_IString.str._M_str);
      if (!bVar16) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,"Imported function ",&local_31);
        IString::toString_abi_cxx11_(&local_220,(IString *)auStack_a0);
        std::operator+(&local_140,&local_240,&local_220);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,&local_140,'.');
        IString::toString_abi_cxx11_(&local_200,(IString *)&module.super_IString.str._M_str);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,&local_200);
        std::operator+(&local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                       "\'s type must be a signature. Given: ");
        HeapType::toString_abi_cxx11_(&local_1e0,(HeapType *)&base.super_IString.str._M_str);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &usedTagNames._M_h._M_single_bucket,&local_58,&local_1e0);
        throwError(this,(string *)&usedTagNames._M_h._M_single_bucket);
      }
      local_58._M_dataplus._M_p = (char *)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      name.super_IString.str._M_str = (char *)local_100.first.super_IString.str._M_len;
      name.super_IString.str._M_len = (size_t)&type;
      Builder::makeFunction
                (name,(HeapType)local_100.first.super_IString.str._M_str,
                 (vector<wasm::Type,_std::allocator<wasm::Type>_> *)base.super_IString.str._M_str,
                 (Expression *)&local_58);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&local_58);
      *(bool *)(type.id + 0x10) = local_100.second;
      *(undefined1 (*) [8])(type.id + 0x18) = auStack_a0;
      *(size_t *)(type.id + 0x20) = module.super_IString.str._M_len;
      *(char **)(type.id + 0x28) = module.super_IString.str._M_str;
      *(size_t *)(type.id + 0x30) = base.super_IString.str._M_len;
      setLocalNames(this,(Function *)type.id,
                    (Index)((ulong)((long)(this->wasm->functions).
                                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->wasm->functions).
                                         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
      Module::addFunction(this->wasm,
                          (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&type)
      ;
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&type);
      break;
    case 1:
      puVar9 = (this->wasm->tables).
               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar10 = (this->wasm->tables).
                super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"timport$",(allocator<char> *)&type);
      NVar17 = makeName(&local_3d8,
                        (long)(this->wasm->tables).
                              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->wasm->tables).
                              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3);
      name_07.super_IString.str._M_str = (char *)&usedFunctionNames._M_h._M_single_bucket;
      name_07.super_IString.str._M_len = (size_t)NVar17.super_IString.str._M_str;
      getOrMakeName((pair<wasm::Name,_bool> *)&local_58,local_b8,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)((ulong)((long)puVar9 - (long)puVar10) >> 3 & 0xffffffff),
                    (Index)NVar17.super_IString.str._M_len,name_07,in_stack_fffffffffffffbf8);
      std::__cxx11::string::~string((string *)&local_3d8);
      sVar12 = local_58._M_string_length;
      _Var11._M_p = local_58._M_dataplus._M_p;
      wasm::Type::Type((Type *)&local_e8,(HeapType)0x10,Nullable,Inexact);
      in_stack_fffffffffffffbf8 =
           (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            *)0x2;
      name_02.super_IString.str._M_str = _Var11._M_p;
      name_02.super_IString.str._M_len = (size_t)&type;
      Builder::makeTable(name_02,(Type)sVar12,local_e8,(Address)0x0,(Type)0xffffffff);
      *(char *)(type.id + 0x10) = local_58.field_2._M_local_buf[0];
      *(undefined1 (*) [8])(type.id + 0x18) = auStack_a0;
      *(size_t *)(type.id + 0x20) = module.super_IString.str._M_len;
      *(char **)(type.id + 0x28) = module.super_IString.str._M_str;
      *(size_t *)(type.id + 0x30) = base.super_IString.str._M_len;
      TVar14 = getType(this);
      *(uintptr_t *)(type.id + 0x50) = TVar14.id;
      getResizableLimits(this,(Address *)(type.id + 0x38),(Address *)(type.id + 0x40),
                         (bool *)local_120,(Type *)(type.id + 0x48),(Address)0xffffffff);
      if (local_120[0] == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,"Tables may not be shared",(allocator<char> *)&local_140);
        throwError(this,&local_1c0);
      }
      Module::addTable(this->wasm,
                       (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&type);
      std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr
                ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&type);
      break;
    case 2:
      puVar5 = (this->wasm->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar6 = (this->wasm->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d8 = uVar15;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"mimport$",(allocator<char> *)&type);
      NVar17 = makeName(&local_1a0,
                        (long)(this->wasm->memories).
                              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->wasm->memories).
                              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3);
      name_05.super_IString.str._M_str = (char *)&usedTableNames._M_h._M_single_bucket;
      name_05.super_IString.str._M_len = (size_t)NVar17.super_IString.str._M_str;
      getOrMakeName((pair<wasm::Name,_bool> *)&local_58,local_c0,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)((ulong)((long)puVar5 - (long)puVar6) >> 3 & 0xffffffff),
                    (Index)NVar17.super_IString.str._M_len,name_05,in_stack_fffffffffffffbf8);
      std::__cxx11::string::~string((string *)&local_1a0);
      in_stack_fffffffffffffbf8 =
           (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            *)0x2;
      name_00.super_IString.str._M_str = local_58._M_dataplus._M_p;
      name_00.super_IString.str._M_len = (size_t)&type;
      Builder::makeMemory(name_00,(Address)local_58._M_string_length,(Address)0x0,false,(Type)0x0);
      *(char *)(type.id + 0x10) = local_58.field_2._M_local_buf[0];
      *(undefined1 (*) [8])(type.id + 0x18) = auStack_a0;
      *(size_t *)(type.id + 0x20) = module.super_IString.str._M_len;
      *(char **)(type.id + 0x28) = module.super_IString.str._M_str;
      *(size_t *)(type.id + 0x30) = base.super_IString.str._M_len;
      getResizableLimits(this,(Address *)(type.id + 0x38),(Address *)(type.id + 0x40),
                         (bool *)(type.id + 0x48),(Type *)(type.id + 0x50),
                         (Address)0xffffffffffffffff);
      uVar15 = local_d8;
      Module::addMemory(this->wasm,
                        (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&type);
      std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
                ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&type);
      break;
    case 3:
      puVar7 = (this->wasm->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar8 = (this->wasm->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,"gimport$",(allocator<char> *)&type);
      NVar17 = makeName(&local_3b8,
                        (long)(this->wasm->globals).
                              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->wasm->globals).
                              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3);
      name_06.super_IString.str._M_str = (char *)&usedMemoryNames._M_h._M_single_bucket;
      name_06.super_IString.str._M_len = (size_t)NVar17.super_IString.str._M_str;
      getOrMakeName((pair<wasm::Name,_bool> *)&local_58,local_c8,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)((ulong)((long)puVar7 - (long)puVar8) >> 3 & 0xffffffff),
                    (Index)NVar17.super_IString.str._M_len,name_06,in_stack_fffffffffffffbf8);
      std::__cxx11::string::~string((string *)&local_3b8);
      TVar14 = getConcreteType(this);
      uVar13 = getU32LEB(this);
      if (1 < uVar13) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"Global mutability must be 0 or 1",(allocator<char> *)&type)
        ;
        throwError(this,&local_180);
      }
      name_01.super_IString.str._M_str = local_58._M_dataplus._M_p;
      name_01.super_IString.str._M_len = (size_t)&type;
      Builder::makeGlobal(name_01,(Type)local_58._M_string_length,(Expression *)TVar14.id,Mutable);
      *(char *)(type.id + 0x10) = local_58.field_2._M_local_buf[0];
      *(undefined1 (*) [8])(type.id + 0x18) = auStack_a0;
      *(size_t *)(type.id + 0x20) = module.super_IString.str._M_len;
      *(char **)(type.id + 0x28) = module.super_IString.str._M_str;
      *(size_t *)(type.id + 0x30) = base.super_IString.str._M_len;
      Module::addGlobal(this->wasm,
                        (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&type);
      std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
                ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&type);
      break;
    case 4:
      puVar3 = (this->wasm->tags).
               super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar4 = (this->wasm->tags).
               super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"eimport$",(allocator<char> *)&type);
      NVar17 = makeName(&local_398,
                        (long)(this->wasm->tags).
                              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->wasm->tags).
                              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3);
      name_04.super_IString.str._M_str = (char *)&usedGlobalNames._M_h._M_single_bucket;
      name_04.super_IString.str._M_len = (size_t)NVar17.super_IString.str._M_str;
      getOrMakeName((pair<wasm::Name,_bool> *)&local_58,local_d0,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)((ulong)((long)puVar3 - (long)puVar4) >> 3 & 0xffffffff),
                    (Index)NVar17.super_IString.str._M_len,name_04,in_stack_fffffffffffffbf8);
      std::__cxx11::string::~string((string *)&local_398);
      getInt8(this);
      uVar13 = getU32LEB(this);
      sVar12 = local_58._M_string_length;
      _Var11._M_p = local_58._M_dataplus._M_p;
      sig = getSignatureByTypeIndex(this,uVar13);
      HeapType::HeapType(&local_e0,sig);
      NVar17.super_IString.str._M_str = _Var11._M_p;
      NVar17.super_IString.str._M_len = (size_t)&type;
      Builder::makeTag(NVar17,(HeapType)sVar12);
      *(char *)(type.id + 0x10) = local_58.field_2._M_local_buf[0];
      *(undefined1 (*) [8])(type.id + 0x18) = auStack_a0;
      *(size_t *)(type.id + 0x20) = module.super_IString.str._M_len;
      *(char **)(type.id + 0x28) = module.super_IString.str._M_str;
      *(size_t *)(type.id + 0x30) = base.super_IString.str._M_len;
      Module::addTag(this->wasm,(unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&type);
      std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr
                ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&type);
      break;
    default:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"bad import kind",(allocator<char> *)&local_58);
      throwError(this,&local_160);
    }
  } while( true );
}

Assistant:

void WasmBinaryReader::readImports() {
  size_t num = getU32LEB();
  Builder builder(wasm);
  std::unordered_set<Name> usedFunctionNames, usedTableNames, usedMemoryNames,
    usedGlobalNames, usedTagNames;
  for (size_t i = 0; i < num; i++) {
    auto module = getInlineString();
    auto base = getInlineString();
    auto kind = (ExternalKind)getU32LEB();
    // We set a unique prefix for the name based on the kind. This ensures no
    // collisions between them, which can't occur here (due to the index i) but
    // could occur later due to the names section.
    switch (kind) {
      case ExternalKind::Function: {
        auto [name, isExplicit] =
          getOrMakeName(functionNames,
                        wasm.functions.size(),
                        makeName("fimport$", wasm.functions.size()),
                        usedFunctionNames);
        auto index = getU32LEB();
        functionTypes.push_back(getTypeByIndex(index));
        auto type = getTypeByIndex(index);
        if (!type.isSignature()) {
          throwError(std::string("Imported function ") + module.toString() +
                     '.' + base.toString() +
                     "'s type must be a signature. Given: " + type.toString());
        }
        auto curr = builder.makeFunction(name, type, {});
        curr->hasExplicitName = isExplicit;
        curr->module = module;
        curr->base = base;
        setLocalNames(*curr, wasm.functions.size());
        wasm.addFunction(std::move(curr));
        break;
      }
      case ExternalKind::Table: {
        auto [name, isExplicit] =
          getOrMakeName(tableNames,
                        wasm.tables.size(),
                        makeName("timport$", wasm.tables.size()),
                        usedTableNames);
        auto table = builder.makeTable(name);
        table->hasExplicitName = isExplicit;
        table->module = module;
        table->base = base;
        table->type = getType();

        bool is_shared;
        getResizableLimits(table->initial,
                           table->max,
                           is_shared,
                           table->addressType,
                           Table::kUnlimitedSize);
        if (is_shared) {
          throwError("Tables may not be shared");
        }
        wasm.addTable(std::move(table));
        break;
      }
      case ExternalKind::Memory: {
        auto [name, isExplicit] =
          getOrMakeName(memoryNames,
                        wasm.memories.size(),
                        makeName("mimport$", wasm.memories.size()),
                        usedMemoryNames);
        auto memory = builder.makeMemory(name);
        memory->hasExplicitName = isExplicit;
        memory->module = module;
        memory->base = base;
        getResizableLimits(memory->initial,
                           memory->max,
                           memory->shared,
                           memory->addressType,
                           Memory::kUnlimitedSize);
        wasm.addMemory(std::move(memory));
        break;
      }
      case ExternalKind::Global: {
        auto [name, isExplicit] =
          getOrMakeName(globalNames,
                        wasm.globals.size(),
                        makeName("gimport$", wasm.globals.size()),
                        usedGlobalNames);
        auto type = getConcreteType();
        auto mutable_ = getU32LEB();
        if (mutable_ & ~1) {
          throwError("Global mutability must be 0 or 1");
        }
        auto curr =
          builder.makeGlobal(name,
                             type,
                             nullptr,
                             mutable_ ? Builder::Mutable : Builder::Immutable);
        curr->hasExplicitName = isExplicit;
        curr->module = module;
        curr->base = base;
        wasm.addGlobal(std::move(curr));
        break;
      }
      case ExternalKind::Tag: {
        auto [name, isExplicit] =
          getOrMakeName(tagNames,
                        wasm.tags.size(),
                        makeName("eimport$", wasm.tags.size()),
                        usedTagNames);
        getInt8(); // Reserved 'attribute' field
        auto index = getU32LEB();
        auto curr = builder.makeTag(name, getSignatureByTypeIndex(index));
        curr->hasExplicitName = isExplicit;
        curr->module = module;
        curr->base = base;
        wasm.addTag(std::move(curr));
        break;
      }
      default: {
        throwError("bad import kind");
      }
    }
  }
  numFuncImports = wasm.functions.size();
}